

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O0

void __thiscall
ring_buffer_base<cubeb_log_message>::ring_buffer_base
          (ring_buffer_base<cubeb_log_message> *this,int capacity)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  cubeb_log_message *pcVar5;
  int in_ESI;
  ring_buffer_base<cubeb_log_message> *in_RDI;
  cubeb_log_message *in_stack_ffffffffffffffb8;
  cubeb_log_message *in_stack_ffffffffffffffc0;
  __int_type __i;
  cubeb_log_message *in_stack_ffffffffffffffc8;
  
  in_RDI->capacity_ = in_ESI + 1;
  std::unique_ptr<cubeb_log_message[],std::default_delete<cubeb_log_message[]>>::
  unique_ptr<std::default_delete<cubeb_log_message[]>,void>
            ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
             in_stack_ffffffffffffffc0);
  iVar2 = storage_capacity(in_RDI);
  uVar3 = (ulong)iVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x100),0);
  if (SUB168(auVar1 * ZEXT816(0x100),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pcVar5 = (cubeb_log_message *)operator_new__(uVar4);
  if (uVar3 != 0) {
    in_stack_ffffffffffffffc0 = pcVar5 + uVar3;
    do {
      in_stack_ffffffffffffffb8 = pcVar5;
      cubeb_log_message::cubeb_log_message(in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffb8 + 1;
      pcVar5 = in_stack_ffffffffffffffc8;
    } while (in_stack_ffffffffffffffc8 != in_stack_ffffffffffffffc0);
  }
  std::unique_ptr<cubeb_log_message[],std::default_delete<cubeb_log_message[]>>::
  reset<cubeb_log_message*,void>
            ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  __i = (__int_type)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  std::__atomic_base<int>::operator=((__atomic_base<int> *)in_stack_ffffffffffffffc8,__i);
  std::__atomic_base<int>::operator=((__atomic_base<int> *)in_stack_ffffffffffffffc8,__i);
  return;
}

Assistant:

ring_buffer_base(int capacity)
      /* One more element to distinguish from empty and full buffer. */
      : capacity_(capacity + 1)
  {
    assert(storage_capacity() < std::numeric_limits<int>::max() / 2 &&
           "buffer too large for the type of index used.");
    assert(capacity_ > 0);

    data_.reset(new T[storage_capacity()]);
    /* If this queue is using atomics, initializing those members as the last
     * action in the constructor acts as a full barrier, and allow capacity() to
     * be thread-safe. */
    write_index_ = 0;
    read_index_ = 0;
  }